

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entt.hpp
# Opt level: O1

void __thiscall
entt::basic_storage<entt::entity,_Swarm,_void>::swap
          (basic_storage<entt::entity,_Swarm,_void> *this,size_type lhs,size_type rhs)

{
  float fVar1;
  pointer pSVar2;
  ulong uVar3;
  
  pSVar2 = (this->instances).super__Vector_base<Swarm,_std::allocator<Swarm>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (long)(this->instances).super__Vector_base<Swarm,_std::allocator<Swarm>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pSVar2 >> 2;
  if (uVar3 <= lhs) {
    __assert_fail("lhs < instances.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/entt/single_include/entt/entt.hpp"
                  ,0x144e,
                  "virtual void entt::basic_storage<entt::entity, Swarm>::swap(const size_type, const size_type) [Entity = entt::entity, Type = Swarm]"
                 );
  }
  if (rhs < uVar3) {
    fVar1 = pSVar2[lhs].value;
    pSVar2[lhs].value = pSVar2[rhs].value;
    pSVar2[rhs].value = fVar1;
    sparse_set<entt::entity>::swap(&this->super_sparse_set<entt::entity>,lhs,rhs);
    return;
  }
  __assert_fail("rhs < instances.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/entt/single_include/entt/entt.hpp"
                ,0x144f,
                "virtual void entt::basic_storage<entt::entity, Swarm>::swap(const size_type, const size_type) [Entity = entt::entity, Type = Swarm]"
               );
}

Assistant:

ENTT_NOEXCEPT override {
        ENTT_ASSERT(lhs < instances.size());
        ENTT_ASSERT(rhs < instances.size());
        std::swap(instances[lhs], instances[rhs]);
        underlying_type::swap(lhs, rhs);
    }